

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O2

bool __thiscall miniros::ServiceManager::isServiceAdvertised(ServiceManager *this,string *serv_name)

{
  __type_conflict _Var1;
  list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
  *__range1;
  ServiceManager *pSVar2;
  
  pSVar2 = this;
  do {
    pSVar2 = (ServiceManager *)
             (pSVar2->service_publications_).
             super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (pSVar2 == this) break;
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((pSVar2->service_publications_).
                             super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                             ._M_impl._M_node._M_size + 0x10),serv_name);
  } while ((!_Var1) ||
          (*(char *)((pSVar2->service_publications_).
                     super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                     ._M_impl._M_node._M_size + 0x100) != '\0'));
  return pSVar2 != this;
}

Assistant:

bool ServiceManager::isServiceAdvertised(const string& serv_name)
{
  for (auto & pub : service_publications_)
  {
    if (pub->getName() == serv_name && !pub->isDropped())
      return true;
  }

  return false;
}